

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_ldc_w(ExecutionEngine *this)

{
  CONSTANT_Long_info CVar1;
  undefined8 uVar2;
  long lVar3;
  Value operand;
  StringObject *this_00;
  allocator *paVar4;
  VMStack *this_01;
  Frame *this_02;
  u1 *puVar5;
  cp_info **ppcVar6;
  cp_info *pcVar7;
  ostream *poVar8;
  u1 *puVar9;
  __type_conflict _Var10;
  undefined8 uStack_130;
  u1 auStack_128 [8];
  double local_120;
  uint local_114;
  StringObject *local_110;
  allocator *local_108;
  u1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0 [16];
  uint local_e0;
  float number;
  int m;
  int e;
  int s;
  u4 floatBytes;
  allocator local_b9;
  string local_b8 [36];
  int local_94;
  ulong uStack_90;
  int i;
  unsigned_long __vla_expr0;
  CONSTANT_Long_info local_80;
  u1 *bytes;
  cp_info utf8Entry;
  Value value;
  cp_info entry;
  cp_info *constantPool;
  u2 index;
  u1 byte2;
  u1 byte1;
  u1 *code;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  puVar9 = auStack_128;
  uStack_130 = 0x134cc4;
  this_01 = VMStack::getInstance();
  uStack_130 = 0x134cd1;
  this_02 = VMStack::getTopFrame(this_01);
  uStack_130 = 0x134ce4;
  puVar5 = Frame::getCode(this_02,this_02->pc);
  constantPool._6_2_ = CONCAT11(puVar5[1],puVar5[2]);
  uStack_130 = 0x134d16;
  ppcVar6 = Frame::getConstantPool(this_02);
  pcVar7 = *ppcVar6 + (int)(constantPool._6_2_ - 1);
  CVar1 = (pcVar7->info).long_info;
  value.data.booleanValue = SUB81(*(undefined8 *)pcVar7,0);
  if (value.data.booleanValue == true) {
    entry._0_2_ = CVar1.high_bytes._0_2_;
    pcVar7 = *ppcVar6 + (int)((ushort)entry._0_2_ - 1);
    puVar9 = *(u1 **)pcVar7;
    uVar2 = *(undefined8 *)&pcVar7->info;
    CVar1 = (CONSTANT_Long_info)(pcVar7->info).utf8_info.bytes;
    bytes._0_1_ = (char)puVar9;
    bytes = puVar9;
    utf8Entry._0_8_ = uVar2;
    utf8Entry.info.long_info = CVar1;
    if ((char)bytes != '\x01') {
      uStack_130 = 0x134dac;
      __assert_fail("utf8Entry.tag == CONSTANT_Utf8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0x1a4,"void ExecutionEngine::i_ldc_w()");
    }
    utf8Entry._0_2_ = SUB82(uVar2,0);
    lVar3 = -(ulong)((ushort)utf8Entry._0_2_ + 0x10 & 0xfffffff0);
    puVar9 = auStack_128 + lVar3;
    for (local_94 = 0; local_94 < (int)(uint)(ushort)utf8Entry._0_2_; local_94 = local_94 + 1) {
      puVar9[local_94] = *(u1 *)((long)CVar1 + (long)local_94);
    }
    puVar9[local_94] = '\0';
    utf8Entry.info._12_4_ = 9;
    local_100 = puVar9;
    uStack_90 = (ulong)((ushort)utf8Entry._0_2_ + 1);
    __vla_expr0 = (unsigned_long)auStack_128;
    local_80 = CVar1;
    *(undefined8 *)((long)&uStack_130 + lVar3) = 0x134e4d;
    local_110 = (StringObject *)operator_new(0x28);
    s._3_1_ = 1;
    local_108 = &local_b9;
    *(undefined8 *)((long)&uStack_130 + lVar3) = 0x134e6e;
    std::allocator<char>::allocator();
    puVar9 = local_100;
    paVar4 = local_108;
    *(undefined8 *)((long)&uStack_130 + lVar3) = 0x134e88;
    std::__cxx11::string::string(local_b8,(char *)puVar9,paVar4);
    this_00 = local_110;
    *(undefined8 *)((long)&uStack_130 + lVar3) = 0x134e9d;
    StringObject::StringObject(this_00,(string *)local_b8);
    s._3_1_ = 0;
    value._0_8_ = local_110;
    *(undefined8 *)((long)&uStack_130 + lVar3) = 0x134ebd;
    std::__cxx11::string::~string(local_b8);
    *(undefined8 *)((long)&uStack_130 + lVar3) = 0x134ec9;
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    puVar9 = (u1 *)__vla_expr0;
  }
  else {
    entry._0_4_ = CVar1.high_bytes;
    if (value.data.booleanValue == true) {
      utf8Entry.info._8_4_ = 4;
      utf8Entry.info._12_4_ = 4;
    }
    else {
      if (value.data.booleanValue != true) {
        uStack_130 = 0x13504d;
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "ldc_w tentando acessar um elemento da CP invalido: ");
        uStack_130 = 0x135059;
        poVar8 = std::operator<<(poVar8,value.data.charValue);
        uStack_130 = 0x135068;
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        uStack_130 = 0x135072;
        exit(1);
      }
      e = entry._0_4_;
      m = -1;
      if (-1 < (int)entry._0_4_) {
        m = 1;
      }
      number = (float)((uint)entry._0_4_ >> 0x17 & 0xff);
      if (number == 0.0) {
        local_114 = (entry._0_4_ & 0x7fffff) << 1;
      }
      else {
        local_114 = entry._0_4_ & 0x7fffff | 0x800000;
      }
      local_e0 = local_114;
      local_120 = (double)(int)(m * local_114);
      uStack_130 = 0x135009;
      _Var10 = std::pow<int,int>(2,(int)number - 0x96);
      local_f0._12_4_ = (undefined4)(local_120 * _Var10);
      utf8Entry.info._12_4_ = 5;
      entry._0_4_ = local_f0._12_4_;
    }
    value.printType = entry._0_4_;
  }
  local_f8 = CONCAT44(utf8Entry.info._12_4_,utf8Entry.info._8_4_);
  local_f0._0_4_ = value.printType;
  local_f0._4_4_ = value.type;
  operand.data = (anon_union_8_10_52016fac_for_data)value._0_8_;
  operand.printType = utf8Entry.info._8_4_;
  operand.type = utf8Entry.info._12_4_;
  puVar9[-8] = 0xa3;
  puVar9[-7] = 'P';
  puVar9[-6] = '\x13';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  Frame::pushIntoOperandStack(this_02,operand);
  this_02->pc = this_02->pc + 3;
  return;
}

Assistant:

void ExecutionEngine::i_ldc_w() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];
    u2 index = (byte1 << 8) | byte2;
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    cp_info entry = constantPool[index-1];
    
    Value value;
    
    if (entry.tag == CONSTANT_String) {
        cp_info utf8Entry = constantPool[entry.info.string_info.string_index-1];
        assert(utf8Entry.tag == CONSTANT_Utf8);
        
        u1* bytes = utf8Entry.info.utf8_info.bytes;
        char utf8String[utf8Entry.info.utf8_info.length+1];
        int i;
        for (i = 0; i < utf8Entry.info.utf8_info.length; i++) {
            utf8String[i] = bytes[i];
        }
        utf8String[i] = '\0';
        
        value.type = ValueType::REFERENCE;
        value.data.object = new StringObject(utf8String);
    } else if (entry.tag == CONSTANT_Integer) {
        value.printType = ValueType::INT;
        value.type = ValueType::INT;
        value.data.intValue = entry.info.integer_info.bytes;
    } else if (entry.tag == CONSTANT_Float) {
        u4 floatBytes = entry.info.float_info.bytes;
        int s = ((floatBytes >> 31) == 0) ? 1 : -1;
        int e = ((floatBytes >> 23) & 0xff);
        int m = (e == 0) ? (floatBytes & 0x7fffff) << 1 : (floatBytes & 0x7fffff) | 0x800000;
        
        float number = s*m*pow(2, e-150);
        value.type = ValueType::FLOAT;
        value.data.floatValue = number;
    } else {
        cerr << "ldc_w tentando acessar um elemento da CP invalido: " << entry.tag << endl;
        exit(1);
    }
    
    topFrame->pushIntoOperandStack(value);
    topFrame->pc += 3;
}